

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SplitterBehavior
               (ImRect *bb,ImGuiID id,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend,float hover_visibility_delay)

{
  ImGuiItemFlags IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImU32 IVar5;
  float *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImGuiMouseCursor cursor_type;
  undefined8 *in_RDI;
  float *in_R8;
  float in_XMM0_Da;
  ImVec2 IVar6;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  ImU32 col;
  float size_2_maximum_delta;
  float size_1_maximum_delta;
  float mouse_delta;
  ImVec2 mouse_delta_2d;
  ImRect bb_render;
  ImRect bb_interact;
  bool held;
  bool hovered;
  bool item_add;
  ImGuiItemFlags item_flags_backup;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff54;
  uint rounding_corners;
  float fVar7;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  ImRect *in_stack_ffffffffffffff78;
  float local_80;
  float fStack_7c;
  ImVec2 in_stack_ffffffffffffff88;
  ImVec2 in_stack_ffffffffffffff90;
  ImVec2 in_stack_ffffffffffffff98;
  float id_00;
  byte local_4f;
  byte local_4e;
  bool local_1;
  
  pIVar3 = GImGui;
  fVar7 = in_stack_ffffffffffffff88.y;
  pIVar2 = GImGui->CurrentWindow;
  IVar1 = (pIVar2->DC).ItemFlags;
  (pIVar2->DC).ItemFlags = (pIVar2->DC).ItemFlags | 0x18;
  bVar4 = ItemAdd(in_stack_ffffffffffffff78,(ImGuiID)in_stack_ffffffffffffff74,
                  (ImRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  (pIVar2->DC).ItemFlags = IVar1;
  if (bVar4) {
    id_00 = (float)((ulong)*in_RDI >> 0x20);
    IVar6 = *(ImVec2 *)(in_RDI + 1);
    if (in_EDX == 1) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff98,0.0,in_XMM2_Da);
      fStack_7c = in_stack_ffffffffffffff5c;
    }
    else {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff98,in_XMM2_Da,0.0);
      fStack_7c = in_stack_ffffffffffffff5c;
    }
    ImRect::Expand((ImRect *)&stack0xffffffffffffffa0,(ImVec2 *)&stack0xffffffffffffff98);
    ButtonBehavior((ImRect *)IVar6,(ImGuiID)id_00,(bool *)in_stack_ffffffffffffff98,
                   (bool *)in_stack_ffffffffffffff90,(ImGuiButtonFlags)fVar7);
    if (pIVar3->ActiveId != in_ESI) {
      SetItemAllowOverlap();
    }
    if (((local_4f & 1) != 0) ||
       (((pIVar3->HoveredId == in_ESI && (pIVar3->HoveredIdPreviousFrame == in_ESI)) &&
        (in_XMM3_Da <= pIVar3->HoveredIdTimer)))) {
      cursor_type = 4;
      if (in_EDX == 1) {
        cursor_type = 3;
      }
      SetMouseCursor(cursor_type);
    }
    if ((local_4f & 1) != 0) {
      ::operator-(in_stack_ffffffffffffff48,(ImVec2 *)0x234fb0);
      IVar6 = ::operator-(in_stack_ffffffffffffff48,(ImVec2 *)0x234fc5);
      if (in_EDX == 1) {
        fStack_7c = IVar6.y;
      }
      else {
        local_80 = IVar6.x;
        fStack_7c = local_80;
      }
      in_stack_ffffffffffffff74 = fStack_7c;
      in_stack_ffffffffffffff70 = ImMax<float>(0.0,*in_RCX - in_XMM0_Da);
      in_stack_ffffffffffffff6c = ImMax<float>(0.0,*in_R8 - in_XMM1_Da);
      if (in_stack_ffffffffffffff74 < -in_stack_ffffffffffffff70) {
        in_stack_ffffffffffffff74 = -in_stack_ffffffffffffff70;
      }
      if (in_stack_ffffffffffffff6c < in_stack_ffffffffffffff74) {
        in_stack_ffffffffffffff74 = in_stack_ffffffffffffff6c;
      }
      if ((in_stack_ffffffffffffff74 != 0.0) || (NAN(in_stack_ffffffffffffff74))) {
        if ((in_stack_ffffffffffffff74 < 0.0) && (*in_RCX + in_stack_ffffffffffffff74 < in_XMM0_Da))
        {
          __assert_fail("*size1 + mouse_delta >= min_size1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                        ,0x565,
                        "bool ImGui::SplitterBehavior(const ImRect &, ImGuiID, ImGuiAxis, float *, float *, float, float, float, float)"
                       );
        }
        if ((0.0 < in_stack_ffffffffffffff74) && (*in_R8 - in_stack_ffffffffffffff74 < in_XMM1_Da))
        {
          __assert_fail("*size2 - mouse_delta >= min_size2",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                        ,0x567,
                        "bool ImGui::SplitterBehavior(const ImRect &, ImGuiID, ImGuiAxis, float *, float *, float, float, float, float)"
                       );
        }
        *in_RCX = in_stack_ffffffffffffff74 + *in_RCX;
        *in_R8 = *in_R8 - in_stack_ffffffffffffff74;
        if (in_EDX == 0) {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff64,in_stack_ffffffffffffff74,0.0);
        }
        else {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff64,0.0,in_stack_ffffffffffffff74);
        }
        ImRect::Translate((ImRect *)&stack0xffffffffffffff88,(ImVec2 *)&stack0xffffffffffffff64);
        MarkItemEdited(in_stack_ffffffffffffff54);
      }
    }
    if ((local_4f & 1) == 0) {
      rounding_corners = in_stack_ffffffffffffff54 & 0xffffff;
      if ((local_4e & 1) != 0) {
        rounding_corners =
             CONCAT13(in_XMM3_Da <= pIVar3->HoveredIdTimer,(int3)in_stack_ffffffffffffff54);
      }
      fVar7 = 3.78351e-44;
      if ((char)(rounding_corners >> 0x18) != '\0') {
        fVar7 = 3.92364e-44;
      }
    }
    else {
      fVar7 = 4.06377e-44;
      rounding_corners = in_stack_ffffffffffffff54;
    }
    IVar5 = GetColorU32((ImGuiCol)in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    ImDrawList::AddRectFilled
              ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff64,IVar5),(ImU32)fStack_7c,fVar7,
               rounding_corners);
    local_1 = (bool)(local_4f & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::SplitterBehavior(const ImRect& bb, ImGuiID id, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend, float hover_visibility_delay)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus;
    bool item_add = ItemAdd(bb, id);
    window->DC.ItemFlags = item_flags_backup;
    if (!item_add)
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (g.HoveredId == id && g.HoveredIdPreviousFrame == id && g.HoveredIdTimer >= hover_visibility_delay))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        float size_1_maximum_delta = ImMax(0.0f, *size1 - min_size1);
        float size_2_maximum_delta = ImMax(0.0f, *size2 - min_size2);
        if (mouse_delta < -size_1_maximum_delta)
            mouse_delta = -size_1_maximum_delta;
        if (mouse_delta > size_2_maximum_delta)
            mouse_delta = size_2_maximum_delta;

        // Apply resize
        if (mouse_delta != 0.0f)
        {
            if (mouse_delta < 0.0f)
                IM_ASSERT(*size1 + mouse_delta >= min_size1);
            if (mouse_delta > 0.0f)
                IM_ASSERT(*size2 - mouse_delta >= min_size2);
            *size1 += mouse_delta;
            *size2 -= mouse_delta;
            bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
            MarkItemEdited(id);
        }
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : (hovered && g.HoveredIdTimer >= hover_visibility_delay) ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, 0.0f);

    return held;
}